

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,ElementCompare *compare,int start,bool type)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int32_t iVar20;
  fpclass_type fVar21;
  int32_t iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint end_00;
  uint uVar28;
  long lVar29;
  uint start_00;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  Element *pEVar35;
  Element local_88;
  
  uVar30 = (ulong)(uint)start;
  if (start + 1 < end) {
    end_00 = end - 1;
    uVar23 = end_00 - start;
    if (0x18 < (int)uVar23) {
LAB_004442f9:
      start_00 = (uint)uVar30;
      iVar24 = (uVar23 >> 1) + start_00;
      pNVar1 = keys + iVar24;
      local_88.val.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)keys[iVar24].val.m_backend.data._M_elems;
      local_88.val.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(keys[iVar24].val.m_backend.data._M_elems + 2);
      puVar2 = keys[iVar24].val.m_backend.data._M_elems + 4;
      local_88.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_88.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[iVar24].val.m_backend.data._M_elems + 8;
      local_88.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_88.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[iVar24].val.m_backend.data._M_elems + 0xc;
      local_88.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_88.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_88.val.m_backend.exp = keys[iVar24].val.m_backend.exp;
      local_88.val.m_backend.neg = keys[iVar24].val.m_backend.neg;
      local_88.val.m_backend.fpclass = keys[iVar24].val.m_backend.fpclass;
      local_88.val.m_backend.prec_elem = keys[iVar24].val.m_backend.prec_elem;
      local_88.idx = keys[iVar24].idx;
      lVar26 = (long)(int)start_00;
      lVar27 = -(long)(int)end_00;
      uVar34 = uVar30;
      uVar23 = end_00;
LAB_004443e0:
      iVar24 = (int)uVar34;
      if ((type & 1U) == 0) {
        if (iVar24 < (int)end_00) {
          pEVar35 = keys + iVar24;
          lVar29 = 0;
          do {
            iVar25 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::ElementCompare::operator()(compare,pEVar35,&local_88);
            if (0 < iVar25) {
              uVar33 = iVar24 - (int)lVar29;
              break;
            }
            lVar29 = lVar29 + -1;
            pEVar35 = pEVar35 + 1;
            uVar33 = end_00;
          } while (iVar24 + lVar27 != lVar29);
          uVar34 = (ulong)uVar33;
        }
        if ((int)uVar23 <= (int)start_00) goto LAB_00444536;
        uVar33 = (uint)uVar34;
        lVar29 = (long)(int)uVar23;
        pEVar35 = keys + lVar29;
        do {
          iVar24 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::ElementCompare::operator()(compare,pEVar35,&local_88);
          if (iVar24 < 1) goto LAB_00444528;
          lVar29 = lVar29 + -1;
          pEVar35 = pEVar35 + -1;
          uVar23 = start_00;
        } while (lVar26 < lVar29);
        goto LAB_0044452d;
      }
      if (iVar24 < (int)end_00) {
        pEVar35 = keys + iVar24;
        lVar29 = 0;
        do {
          iVar25 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::ElementCompare::operator()(compare,pEVar35,&local_88);
          if (-1 < iVar25) {
            uVar33 = iVar24 - (int)lVar29;
            break;
          }
          lVar29 = lVar29 + -1;
          pEVar35 = pEVar35 + 1;
          uVar33 = end_00;
        } while (iVar24 + lVar27 != lVar29);
        uVar34 = (ulong)uVar33;
      }
      uVar33 = (uint)uVar34;
      if ((int)start_00 < (int)uVar23) {
        lVar29 = (long)(int)uVar23;
        pEVar35 = keys + lVar29;
        do {
          iVar24 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::ElementCompare::operator()(compare,pEVar35,&local_88);
          if (iVar24 < 0) goto LAB_00444528;
          lVar29 = lVar29 + -1;
          pEVar35 = pEVar35 + -1;
          uVar23 = start_00;
        } while (lVar26 < lVar29);
        goto LAB_0044452d;
      }
      goto LAB_00444536;
    }
LAB_0044490b:
    if (0 < (int)uVar23) {
      SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                (keys,end_00,compare,start);
    }
  }
  return;
LAB_00444528:
  uVar23 = (uint)lVar29;
LAB_0044452d:
  uVar34 = (ulong)uVar33;
LAB_00444536:
  iVar24 = (int)uVar34;
  if ((int)uVar23 <= iVar24) goto LAB_0044462c;
  uVar5 = *(undefined8 *)keys[iVar24].val.m_backend.data._M_elems;
  uVar6 = *(undefined8 *)(keys[iVar24].val.m_backend.data._M_elems + 2);
  puVar2 = keys[iVar24].val.m_backend.data._M_elems + 4;
  uVar7 = *(undefined8 *)puVar2;
  uVar8 = *(undefined8 *)(puVar2 + 2);
  puVar2 = keys[iVar24].val.m_backend.data._M_elems + 8;
  uVar9 = *(undefined8 *)puVar2;
  uVar10 = *(undefined8 *)(puVar2 + 2);
  puVar2 = keys[iVar24].val.m_backend.data._M_elems + 0xc;
  uVar11 = *(undefined8 *)puVar2;
  uVar12 = *(undefined8 *)(puVar2 + 2);
  iVar25 = keys[iVar24].val.m_backend.exp;
  bVar3 = keys[iVar24].val.m_backend.neg;
  iVar4 = keys[iVar24].idx;
  uVar13 = *(undefined8 *)(keys[(int)uVar23].val.m_backend.data._M_elems + 2);
  puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 4;
  uVar14 = *(undefined8 *)puVar2;
  uVar15 = *(undefined8 *)(puVar2 + 2);
  puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 8;
  uVar16 = *(undefined8 *)puVar2;
  uVar17 = *(undefined8 *)(puVar2 + 2);
  puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 0xc;
  uVar18 = *(undefined8 *)puVar2;
  uVar19 = *(undefined8 *)(puVar2 + 2);
  *(undefined8 *)keys[iVar24].val.m_backend.data._M_elems =
       *(undefined8 *)keys[(int)uVar23].val.m_backend.data._M_elems;
  *(undefined8 *)(keys[iVar24].val.m_backend.data._M_elems + 2) = uVar13;
  puVar2 = keys[iVar24].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = uVar14;
  *(undefined8 *)(puVar2 + 2) = uVar15;
  puVar2 = keys[iVar24].val.m_backend.data._M_elems + 8;
  *(undefined8 *)puVar2 = uVar16;
  *(undefined8 *)(puVar2 + 2) = uVar17;
  puVar2 = keys[iVar24].val.m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar2 = uVar18;
  *(undefined8 *)(puVar2 + 2) = uVar19;
  keys[iVar24].val.m_backend.exp = keys[(int)uVar23].val.m_backend.exp;
  keys[iVar24].val.m_backend.neg = keys[(int)uVar23].val.m_backend.neg;
  keys[iVar24].idx = keys[(int)uVar23].idx;
  puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar2 = uVar11;
  *(undefined8 *)(puVar2 + 2) = uVar12;
  puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 8;
  *(undefined8 *)puVar2 = uVar9;
  *(undefined8 *)(puVar2 + 2) = uVar10;
  puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = uVar7;
  *(undefined8 *)(puVar2 + 2) = uVar8;
  *(undefined8 *)keys[(int)uVar23].val.m_backend.data._M_elems = uVar5;
  *(undefined8 *)(keys[(int)uVar23].val.m_backend.data._M_elems + 2) = uVar6;
  keys[(int)uVar23].val.m_backend.exp = iVar25;
  keys[(int)uVar23].val.m_backend.neg = bVar3;
  fVar21 = keys[iVar24].val.m_backend.fpclass;
  iVar22 = keys[iVar24].val.m_backend.prec_elem;
  iVar20 = keys[(int)uVar23].val.m_backend.prec_elem;
  keys[iVar24].val.m_backend.fpclass = keys[(int)uVar23].val.m_backend.fpclass;
  keys[iVar24].val.m_backend.prec_elem = iVar20;
  keys[(int)uVar23].val.m_backend.fpclass = fVar21;
  keys[(int)uVar23].val.m_backend.prec_elem = iVar22;
  keys[(int)uVar23].idx = iVar4;
  uVar34 = (ulong)(iVar24 + 1);
  uVar23 = uVar23 - 1;
  goto LAB_004443e0;
LAB_0044462c:
  if ((type & 1U) == 0) {
    if ((int)start_00 < (int)uVar23) {
      uVar31 = (ulong)(int)uVar23;
      pEVar35 = keys + uVar31;
      do {
        iVar24 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::ElementCompare::operator()(compare,&local_88,pEVar35);
        uVar32 = uVar31;
        if (0 < iVar24) break;
        uVar31 = uVar31 - 1;
        pEVar35 = pEVar35 + -1;
        uVar32 = uVar30;
      } while (lVar26 < (long)uVar31);
      uVar23 = (uint)uVar32;
    }
    if (uVar23 == end_00) {
      uVar5 = *(undefined8 *)keys[(int)uVar23].val.m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(keys[(int)uVar23].val.m_backend.data._M_elems + 2);
      puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar2;
      uVar8 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 8;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 0xc;
      uVar11 = *(undefined8 *)puVar2;
      uVar12 = *(undefined8 *)(puVar2 + 2);
      iVar24 = keys[(int)uVar23].val.m_backend.exp;
      bVar3 = keys[(int)uVar23].val.m_backend.neg;
      iVar25 = keys[(int)uVar23].idx;
      uVar13 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar14 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar15 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      uVar16 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      uVar17 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10);
      uVar18 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc);
      uVar19 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[(int)uVar23].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[(int)uVar23].val.m_backend.data._M_elems + 2) = uVar13;
      puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar14;
      *(undefined8 *)(puVar2 + 2) = uVar15;
      puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar16;
      *(undefined8 *)(puVar2 + 2) = uVar17;
      puVar2 = keys[(int)uVar23].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar18;
      *(undefined8 *)(puVar2 + 2) = uVar19;
      keys[(int)uVar23].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[(int)uVar23].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[(int)uVar23].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc) = uVar11;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe) = uVar12;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar9;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10) = uVar10;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar7;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar8;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar6;
      (pNVar1->val).m_backend.exp = iVar24;
      (pNVar1->val).m_backend.neg = bVar3;
      fVar21 = keys[(int)uVar23].val.m_backend.fpclass;
      iVar22 = keys[(int)uVar23].val.m_backend.prec_elem;
      iVar20 = (pNVar1->val).m_backend.prec_elem;
      keys[(int)uVar23].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[(int)uVar23].val.m_backend.prec_elem = iVar20;
      (pNVar1->val).m_backend.fpclass = fVar21;
      (pNVar1->val).m_backend.prec_elem = iVar22;
      pNVar1->idx = iVar25;
      uVar23 = uVar23 - 1;
    }
  }
  else {
    if (iVar24 < (int)end_00) {
      pEVar35 = keys + iVar24;
      lVar26 = 0;
      do {
        iVar25 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::ElementCompare::operator()(compare,&local_88,pEVar35);
        if (iVar25 < 0) {
          uVar33 = iVar24 - (int)lVar26;
          break;
        }
        lVar26 = lVar26 + -1;
        pEVar35 = pEVar35 + 1;
        uVar33 = end_00;
      } while ((long)iVar24 - (long)(int)end_00 != lVar26);
      uVar34 = (ulong)uVar33;
    }
    uVar33 = (uint)uVar34;
    if (uVar33 == start_00) {
      uVar5 = *(undefined8 *)keys[(int)uVar33].val.m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(keys[(int)uVar33].val.m_backend.data._M_elems + 2);
      puVar2 = keys[(int)uVar33].val.m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar2;
      uVar8 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar33].val.m_backend.data._M_elems + 8;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar33].val.m_backend.data._M_elems + 0xc;
      uVar11 = *(undefined8 *)puVar2;
      uVar12 = *(undefined8 *)(puVar2 + 2);
      iVar24 = keys[(int)uVar33].val.m_backend.exp;
      bVar3 = keys[(int)uVar33].val.m_backend.neg;
      iVar25 = keys[(int)uVar33].idx;
      uVar13 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar14 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar15 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      uVar16 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      uVar17 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10);
      uVar18 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc);
      uVar19 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[(int)uVar33].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[(int)uVar33].val.m_backend.data._M_elems + 2) = uVar13;
      puVar2 = keys[(int)uVar33].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar14;
      *(undefined8 *)(puVar2 + 2) = uVar15;
      puVar2 = keys[(int)uVar33].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar16;
      *(undefined8 *)(puVar2 + 2) = uVar17;
      puVar2 = keys[(int)uVar33].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar18;
      *(undefined8 *)(puVar2 + 2) = uVar19;
      keys[(int)uVar33].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[(int)uVar33].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[(int)uVar33].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc) = uVar11;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe) = uVar12;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar9;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10) = uVar10;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar7;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar8;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar6;
      (pNVar1->val).m_backend.exp = iVar24;
      (pNVar1->val).m_backend.neg = bVar3;
      fVar21 = keys[(int)uVar33].val.m_backend.fpclass;
      iVar22 = keys[(int)uVar33].val.m_backend.prec_elem;
      iVar20 = (pNVar1->val).m_backend.prec_elem;
      keys[(int)uVar33].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[(int)uVar33].val.m_backend.prec_elem = iVar20;
      (pNVar1->val).m_backend.fpclass = fVar21;
      (pNVar1->val).m_backend.prec_elem = iVar22;
      pNVar1->idx = iVar25;
      uVar34 = (ulong)(uVar33 + 1);
    }
  }
  uVar33 = (uint)uVar34;
  if ((int)(end_00 - uVar33) < (int)(uVar23 - start_00)) {
    uVar34 = uVar30;
    uVar28 = uVar23;
    uVar23 = end_00;
    start_00 = uVar33;
    if ((int)end_00 <= (int)uVar33) goto LAB_004448f1;
  }
  else {
    uVar30 = uVar34;
    uVar28 = end_00;
    if ((int)uVar23 <= (int)start_00) goto LAB_004448f1;
  }
  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
            (keys,uVar23 + 1,compare,start_00,(bool)(~type & 1));
  uVar30 = uVar34;
LAB_004448f1:
  end_00 = uVar28;
  type = (bool)(type ^ 1);
  start = (int)uVar30;
  uVar23 = end_00 - start;
  if ((int)uVar23 < 0x19) goto LAB_0044490b;
  goto LAB_004442f9;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}